

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scp.c
# Opt level: O0

LIBSSH2_CHANNEL * scp_recv(LIBSSH2_SESSION *session,char *path,libssh2_struct_stat *sb)

{
  int iVar1;
  size_t sVar2;
  undefined8 uVar3;
  size_t sVar4;
  LIBSSH2_CHANNEL *pLVar5;
  ssize_t sVar6;
  long lVar7;
  longlong lVar8;
  char *pcVar9;
  bool bVar10;
  char *local_80;
  char *e;
  char *p_1;
  char *s_1;
  char *err_msg;
  size_t err_len;
  uchar *p;
  uchar *s;
  size_t path_len;
  char *tmp_err_msg;
  int tmp_err_code;
  int rc;
  size_t cmd_len;
  libssh2_struct_stat *sb_local;
  char *path_local;
  LIBSSH2_SESSION *session_local;
  
  cmd_len = (size_t)sb;
  sb_local = (libssh2_struct_stat *)path;
  path_local = (char *)session;
  if (session->scpRecv_state == libssh2_NB_state_idle) {
    session->scpRecv_mode = 0;
    session->scpRecv_size = 0;
    session->scpRecv_mtime = 0;
    session->scpRecv_atime = 0;
    sVar2 = strlen(path);
    *(size_t *)(path_local + 0x13bf0) = sVar2 * 3 + 10 + (long)(int)(uint)(cmd_len != 0);
    uVar3 = (**(code **)(path_local + 8))(*(undefined8 *)(path_local + 0x13bf0),path_local);
    *(undefined8 *)(path_local + 0x13be8) = uVar3;
    if (*(long *)(path_local + 0x13be8) == 0) {
      _libssh2_error((LIBSSH2_SESSION *)path_local,-6,
                     "Unable to allocate a command buffer for SCP session");
      return (LIBSSH2_CHANNEL *)0x0;
    }
    pcVar9 = "";
    if (cmd_len != 0) {
      pcVar9 = "p";
    }
    snprintf(*(char **)(path_local + 0x13be8),*(size_t *)(path_local + 0x13bf0),"scp -%sf ",pcVar9);
    _tmp_err_code = (uchar *)strlen(*(char **)(path_local + 0x13be8));
    if (*(int *)(path_local + 0x8c) == 0) {
      s = (uchar *)strlen((char *)sb_local);
      memcpy((void *)(*(long *)(path_local + 0x13be8) + (long)_tmp_err_code),sb_local,(size_t)s);
      _tmp_err_code = s + (long)_tmp_err_code;
    }
    else {
      sVar4 = shell_quotearg((char *)sb_local,
                             (uchar *)(*(long *)(path_local + 0x13be8) + (long)_tmp_err_code),
                             *(long *)(path_local + 0x13bf0) - (long)_tmp_err_code);
      _tmp_err_code = (uchar *)(sVar4 + (long)_tmp_err_code);
    }
    *(uchar **)(path_local + 0x13bf0) = _tmp_err_code;
    path_local[0x13be0] = '\x02';
    path_local[0x13be1] = '\0';
    path_local[0x13be2] = '\0';
    path_local[0x13be3] = '\0';
  }
  if (*(int *)(path_local + 0x13be0) == 2) {
    pLVar5 = _libssh2_channel_open
                       ((LIBSSH2_SESSION *)path_local,"session",7,0x200000,0x8000,(uchar *)0x0,0);
    *(LIBSSH2_CHANNEL **)(path_local + 0x13d20) = pLVar5;
    if (*(long *)(path_local + 0x13d20) == 0) {
      iVar1 = libssh2_session_last_errno((LIBSSH2_SESSION *)path_local);
      if (iVar1 == -0x25) {
        _libssh2_error((LIBSSH2_SESSION *)path_local,-0x25,"Would block starting up channel");
      }
      else {
        (**(code **)(path_local + 0x18))(*(undefined8 *)(path_local + 0x13be8),path_local);
        path_local[0x13be8] = '\0';
        path_local[0x13be9] = '\0';
        path_local[0x13bea] = '\0';
        path_local[0x13beb] = '\0';
        path_local[0x13bec] = '\0';
        path_local[0x13bed] = '\0';
        path_local[0x13bee] = '\0';
        path_local[0x13bef] = '\0';
        path_local[0x13be0] = '\0';
        path_local[0x13be1] = '\0';
        path_local[0x13be2] = '\0';
        path_local[0x13be3] = '\0';
      }
      return (LIBSSH2_CHANNEL *)0x0;
    }
    path_local[0x13be0] = '\x03';
    path_local[0x13be1] = '\0';
    path_local[0x13be2] = '\0';
    path_local[0x13be3] = '\0';
  }
  if (*(int *)(path_local + 0x13be0) == 3) {
    tmp_err_msg._4_4_ =
         _libssh2_channel_process_startup
                   (*(LIBSSH2_CHANNEL **)(path_local + 0x13d20),"exec",4,
                    *(char **)(path_local + 0x13be8),*(size_t *)(path_local + 0x13bf0));
    if (tmp_err_msg._4_4_ == -0x25) {
      _libssh2_error((LIBSSH2_SESSION *)path_local,-0x25,"Would block requesting SCP startup");
      return (LIBSSH2_CHANNEL *)0x0;
    }
    if (tmp_err_msg._4_4_ != 0) {
      (**(code **)(path_local + 0x18))(*(undefined8 *)(path_local + 0x13be8),path_local);
      path_local[0x13be8] = '\0';
      path_local[0x13be9] = '\0';
      path_local[0x13bea] = '\0';
      path_local[0x13beb] = '\0';
      path_local[0x13bec] = '\0';
      path_local[0x13bed] = '\0';
      path_local[0x13bee] = '\0';
      path_local[0x13bef] = '\0';
      goto LAB_00131a3d;
    }
    (**(code **)(path_local + 0x18))(*(undefined8 *)(path_local + 0x13be8));
    path_local[0x13be8] = '\0';
    path_local[0x13be9] = '\0';
    path_local[0x13bea] = '\0';
    path_local[0x13beb] = '\0';
    path_local[0x13bec] = '\0';
    path_local[0x13bed] = '\0';
    path_local[0x13bee] = '\0';
    path_local[0x13bef] = '\0';
    path_local[0x13bf8] = '\0';
    path_local[0x13be0] = '\x04';
    path_local[0x13be1] = '\0';
    path_local[0x13be2] = '\0';
    path_local[0x13be3] = '\0';
  }
  if (*(int *)(path_local + 0x13be0) == 4) {
    sVar6 = _libssh2_channel_write
                      (*(LIBSSH2_CHANNEL **)(path_local + 0x13d20),0,(uchar *)(path_local + 0x13bf8)
                       ,1);
    tmp_err_msg._4_4_ = (int)sVar6;
    if (tmp_err_msg._4_4_ == -0x25) {
      _libssh2_error((LIBSSH2_SESSION *)path_local,-0x25,"Would block sending initial wakeup");
      return (LIBSSH2_CHANNEL *)0x0;
    }
    if (tmp_err_msg._4_4_ != 1) goto LAB_00131a3d;
    path_local[0x13cf8] = '\0';
    path_local[0x13cf9] = '\0';
    path_local[0x13cfa] = '\0';
    path_local[0x13cfb] = '\0';
    path_local[0x13cfc] = '\0';
    path_local[0x13cfd] = '\0';
    path_local[0x13cfe] = '\0';
    path_local[0x13cff] = '\0';
    path_local[0x13be0] = '\x05';
    path_local[0x13be1] = '\0';
    path_local[0x13be2] = '\0';
    path_local[0x13be3] = '\0';
    tmp_err_msg._4_4_ = 1;
  }
  if ((*(int *)(path_local + 0x13be0) != 5) && (*(int *)(path_local + 0x13be0) != 6)) {
LAB_001314c3:
    if (*(int *)(path_local + 0x13be0) == 7) {
      path_local[0x13cf8] = '\0';
      path_local[0x13cf9] = '\0';
      path_local[0x13cfa] = '\0';
      path_local[0x13cfb] = '\0';
      path_local[0x13cfc] = '\0';
      path_local[0x13cfd] = '\0';
      path_local[0x13cfe] = '\0';
      path_local[0x13cff] = '\0';
      path_local[0x13be0] = '\b';
      path_local[0x13be1] = '\0';
      path_local[0x13be2] = '\0';
      path_local[0x13be3] = '\0';
    }
    if ((*(int *)(path_local + 0x13be0) == 8) || (*(int *)(path_local + 0x13be0) == 9)) {
LAB_0013150d:
      do {
        if (0xff < *(ulong *)(path_local + 0x13cf8)) goto LAB_00131969;
        local_80 = (char *)0x0;
        if (*(int *)(path_local + 0x13be0) == 8) {
          sVar6 = _libssh2_channel_read
                            (*(LIBSSH2_CHANNEL **)(path_local + 0x13d20),0,
                             path_local + *(long *)(path_local + 0x13cf8) + 0x13bf8,1);
          tmp_err_msg._4_4_ = (int)sVar6;
          if (tmp_err_msg._4_4_ == -0x25) {
            _libssh2_error((LIBSSH2_SESSION *)path_local,-0x25,
                           "Would block waiting for SCP response");
            return (LIBSSH2_CHANNEL *)0x0;
          }
          if (tmp_err_msg._4_4_ < 0) {
            _libssh2_error((LIBSSH2_SESSION *)path_local,tmp_err_msg._4_4_,
                           "Failed reading SCP response");
            goto LAB_00131a3d;
          }
          if (tmp_err_msg._4_4_ == 0) goto LAB_001319fe;
          *(long *)(path_local + 0x13cf8) = *(long *)(path_local + 0x13cf8) + 1;
          if (path_local[0x13bf8] != 'C') {
            _libssh2_error((LIBSSH2_SESSION *)path_local,-0x1c,"Invalid response from SCP server");
            goto LAB_00131a3d;
          }
          if ((((1 < *(ulong *)(path_local + 0x13cf8)) &&
               (path_local[*(long *)(path_local + 0x13cf8) + 0x13bf7] != '\r')) &&
              (path_local[*(long *)(path_local + 0x13cf8) + 0x13bf7] != '\n')) &&
             ((byte)path_local[*(long *)(path_local + 0x13cf8) + 0x13bf7] < 0x20)) {
            _libssh2_error((LIBSSH2_SESSION *)path_local,-0x1c,"Invalid data in SCP response");
            goto LAB_00131a3d;
          }
          if ((*(ulong *)(path_local + 0x13cf8) < 7) ||
             (path_local[*(long *)(path_local + 0x13cf8) + 0x13bf7] != '\n')) {
            if (*(long *)(path_local + 0x13cf8) == 0x100) {
              _libssh2_error((LIBSSH2_SESSION *)path_local,-0x1c,
                             "Unterminated response from SCP server");
              goto LAB_00131a3d;
            }
            goto LAB_0013150d;
          }
          while( true ) {
            bVar10 = true;
            if (path_local[*(long *)(path_local + 0x13cf8) + 0x13bf7] != '\r') {
              bVar10 = path_local[*(long *)(path_local + 0x13cf8) + 0x13bf7] == '\n';
            }
            if (!bVar10) break;
            *(long *)(path_local + 0x13cf8) = *(long *)(path_local + 0x13cf8) + -1;
          }
          path_local[*(long *)(path_local + 0x13cf8) + 0x13bf8] = '\0';
          if (*(ulong *)(path_local + 0x13cf8) < 6) {
            _libssh2_error((LIBSSH2_SESSION *)path_local,-0x1c,
                           "Invalid response from SCP server, too short");
            goto LAB_00131a3d;
          }
          p_1 = path_local + 0x13bf9;
          pcVar9 = strchr(p_1,0x20);
          if ((pcVar9 == (char *)0x0) || ((long)pcVar9 - (long)p_1 < 1)) {
            e = pcVar9;
            _libssh2_error((LIBSSH2_SESSION *)path_local,-0x1c,
                           "Invalid response from SCP server, malformed mode");
            goto LAB_00131a3d;
          }
          e = pcVar9 + 1;
          *pcVar9 = '\0';
          lVar7 = strtol(p_1,&local_80,8);
          *(long *)(path_local + 0x13d00) = lVar7;
          if ((local_80 != (char *)0x0) && (*local_80 != '\0')) {
            _libssh2_error((LIBSSH2_SESSION *)path_local,-0x1c,
                           "Invalid response from SCP server, invalid mode");
            goto LAB_00131a3d;
          }
          p_1 = strchr(e,0x20);
          if ((p_1 == (char *)0x0) || ((long)p_1 - (long)e < 1)) {
            _libssh2_error((LIBSSH2_SESSION *)path_local,-0x1c,
                           "Invalid response from SCP server, too short or malformed");
            goto LAB_00131a3d;
          }
          *p_1 = '\0';
          lVar8 = strtoll(e,&local_80,10);
          *(longlong *)(path_local + 0x13d08) = lVar8;
          if ((local_80 != (char *)0x0) && (*local_80 != '\0')) {
            _libssh2_error((LIBSSH2_SESSION *)path_local,-0x1c,
                           "Invalid response from SCP server, invalid size");
            goto LAB_00131a3d;
          }
          path_local[0x13bf8] = '\0';
          path_local[0x13be0] = '\t';
          path_local[0x13be1] = '\0';
          path_local[0x13be2] = '\0';
          path_local[0x13be3] = '\0';
        }
      } while (*(int *)(path_local + 0x13be0) != 9);
      sVar6 = _libssh2_channel_write
                        (*(LIBSSH2_CHANNEL **)(path_local + 0x13d20),0,
                         (uchar *)(path_local + 0x13bf8),1);
      tmp_err_msg._4_4_ = (int)sVar6;
      if (tmp_err_msg._4_4_ == -0x25) {
        _libssh2_error((LIBSSH2_SESSION *)path_local,-0x25,"Would block sending SCP ACK");
        return (LIBSSH2_CHANNEL *)0x0;
      }
      if (tmp_err_msg._4_4_ != 1) goto LAB_00131a3d;
      tmp_err_msg._4_4_ = 1;
LAB_00131969:
      path_local[0x13be0] = '\n';
      path_local[0x13be1] = '\0';
      path_local[0x13be2] = '\0';
      path_local[0x13be3] = '\0';
    }
    if (cmd_len != 0) {
      memset((void *)cmd_len,0,0x90);
      *(undefined8 *)(cmd_len + 0x58) = *(undefined8 *)(path_local + 0x13d10);
      *(undefined8 *)(cmd_len + 0x48) = *(undefined8 *)(path_local + 0x13d18);
      *(undefined8 *)(cmd_len + 0x30) = *(undefined8 *)(path_local + 0x13d08);
      *(uint *)(cmd_len + 0x18) = (uint)*(undefined8 *)(path_local + 0x13d00) & 0xffff;
    }
    path_local[0x13be0] = '\0';
    path_local[0x13be1] = '\0';
    path_local[0x13be2] = '\0';
    path_local[0x13be3] = '\0';
    return *(LIBSSH2_CHANNEL **)(path_local + 0x13d20);
  }
LAB_00130f80:
  do {
    bVar10 = false;
    if (cmd_len != 0) {
      bVar10 = *(ulong *)(path_local + 0x13cf8) < 0x100;
    }
    if (!bVar10) {
LAB_001314b5:
      path_local[0x13be0] = '\a';
      path_local[0x13be1] = '\0';
      path_local[0x13be2] = '\0';
      path_local[0x13be3] = '\0';
      goto LAB_001314c3;
    }
    if (*(int *)(path_local + 0x13be0) != 5) {
LAB_00131443:
      if (*(int *)(path_local + 0x13be0) == 6) {
        sVar6 = _libssh2_channel_write
                          (*(LIBSSH2_CHANNEL **)(path_local + 0x13d20),0,
                           (uchar *)(path_local + 0x13bf8),1);
        tmp_err_msg._4_4_ = (int)sVar6;
        if (tmp_err_msg._4_4_ == -0x25) {
          _libssh2_error((LIBSSH2_SESSION *)path_local,-0x25,"Would block waiting to send SCP ACK");
          return (LIBSSH2_CHANNEL *)0x0;
        }
        if (tmp_err_msg._4_4_ == 1) {
          tmp_err_msg._4_4_ = 1;
          goto LAB_001314b5;
        }
        goto LAB_00131a3d;
      }
      goto LAB_00130f80;
    }
    sVar6 = _libssh2_channel_read
                      (*(LIBSSH2_CHANNEL **)(path_local + 0x13d20),0,
                       path_local + *(long *)(path_local + 0x13cf8) + 0x13bf8,1);
    tmp_err_msg._4_4_ = (int)sVar6;
    if (tmp_err_msg._4_4_ == -0x25) {
      _libssh2_error((LIBSSH2_SESSION *)path_local,-0x25,"Would block waiting for SCP response");
      return (LIBSSH2_CHANNEL *)0x0;
    }
    if (tmp_err_msg._4_4_ < 0) {
      _libssh2_error((LIBSSH2_SESSION *)path_local,tmp_err_msg._4_4_,"Failed reading SCP response");
      goto LAB_00131a3d;
    }
    if (tmp_err_msg._4_4_ == 0) goto LAB_001319fe;
    *(long *)(path_local + 0x13cf8) = *(long *)(path_local + 0x13cf8) + 1;
    if (path_local[0x13bf8] != 'T') {
      err_msg = (char *)_libssh2_channel_packet_data_len
                                  (*(LIBSSH2_CHANNEL **)(path_local + 0x13d20),0);
      s_1 = (char *)(**(code **)(path_local + 8))(err_msg + 1);
      if (s_1 == (char *)0x0) {
        _libssh2_error((LIBSSH2_SESSION *)path_local,-6,"Failed to get memory ");
      }
      else {
        _libssh2_channel_read(*(LIBSSH2_CHANNEL **)(path_local + 0x13d20),0,s_1,(size_t)err_msg);
        s_1[(long)err_msg] = '\0';
        _libssh2_error((LIBSSH2_SESSION *)path_local,-0x1c,"Failed to recv file");
        (**(code **)(path_local + 0x18))(s_1,path_local);
      }
      goto LAB_00131a3d;
    }
    if ((1 < *(ulong *)(path_local + 0x13cf8)) &&
       (((((byte)path_local[*(long *)(path_local + 0x13cf8) + 0x13bf7] < 0x30 ||
          (0x39 < (byte)path_local[*(long *)(path_local + 0x13cf8) + 0x13bf7])) &&
         (path_local[*(long *)(path_local + 0x13cf8) + 0x13bf7] != ' ')) &&
        ((path_local[*(long *)(path_local + 0x13cf8) + 0x13bf7] != '\r' &&
         (path_local[*(long *)(path_local + 0x13cf8) + 0x13bf7] != '\n')))))) {
      _libssh2_error((LIBSSH2_SESSION *)path_local,-0x1c,"Invalid data in SCP response");
      goto LAB_00131a3d;
    }
    if ((8 < *(ulong *)(path_local + 0x13cf8)) &&
       (path_local[*(long *)(path_local + 0x13cf8) + 0x13bf7] == '\n')) {
      while( true ) {
        bVar10 = true;
        if (path_local[*(long *)(path_local + 0x13cf8) + 0x13bf7] != '\r') {
          bVar10 = path_local[*(long *)(path_local + 0x13cf8) + 0x13bf7] == '\n';
        }
        if (!bVar10) break;
        *(long *)(path_local + 0x13cf8) = *(long *)(path_local + 0x13cf8) + -1;
      }
      path_local[*(long *)(path_local + 0x13cf8) + 0x13bf8] = '\0';
      if (*(ulong *)(path_local + 0x13cf8) < 8) {
        _libssh2_error((LIBSSH2_SESSION *)path_local,-0x1c,
                       "Invalid response from SCP server, too short");
      }
      else {
        p = (uchar *)(path_local + 0x13bf9);
        pcVar9 = strchr((char *)p,0x20);
        if ((pcVar9 == (char *)0x0) || ((long)pcVar9 - (long)p < 1)) {
          err_len = (size_t)pcVar9;
          _libssh2_error((LIBSSH2_SESSION *)path_local,-0x1c,
                         "Invalid response from SCP server, malformed mtime");
        }
        else {
          err_len = (size_t)(pcVar9 + 1);
          *pcVar9 = '\0';
          lVar7 = strtol((char *)p,(char **)0x0,10);
          *(long *)(path_local + 0x13d10) = lVar7;
          p = (uchar *)strchr((char *)err_len,0x20);
          if ((p == (uchar *)0x0) || ((long)((long)p - err_len) < 1)) {
            _libssh2_error((LIBSSH2_SESSION *)path_local,-0x1c,
                           "Invalid response from SCP server, malformed mtime.usec");
          }
          else {
            p = p + 1;
            err_len = (size_t)strchr((char *)p,0x20);
            if (((char *)err_len != (char *)0x0) && (0 < (long)(err_len - (long)p))) {
              *(char *)err_len = '\0';
              lVar7 = strtol((char *)p,(char **)0x0,10);
              *(long *)(path_local + 0x13d18) = lVar7;
              path_local[0x13bf8] = '\0';
              path_local[0x13be0] = '\x06';
              path_local[0x13be1] = '\0';
              path_local[0x13be2] = '\0';
              path_local[0x13be3] = '\0';
              goto LAB_00131443;
            }
            _libssh2_error((LIBSSH2_SESSION *)path_local,-0x1c,
                           "Invalid response from SCP server, too short or malformed");
          }
        }
      }
      goto LAB_00131a3d;
    }
  } while (*(long *)(path_local + 0x13cf8) != 0x100);
  _libssh2_error((LIBSSH2_SESSION *)path_local,-0x1c,"Unterminated response from SCP server");
  goto LAB_00131a3d;
LAB_001319fe:
  iVar1 = libssh2_channel_eof(*(LIBSSH2_CHANNEL **)(path_local + 0x13d20));
  if (iVar1 == 0) {
    return *(LIBSSH2_CHANNEL **)(path_local + 0x13d20);
  }
  _libssh2_error((LIBSSH2_SESSION *)path_local,-0x1c,"Unexpected channel close");
LAB_00131a3d:
  tmp_err_msg._0_4_ = *(undefined4 *)(path_local + 600);
  path_len = *(size_t *)(path_local + 0x250);
  do {
    iVar1 = libssh2_channel_free(*(LIBSSH2_CHANNEL **)(path_local + 0x13d20));
  } while (iVar1 == -0x25);
  *(undefined4 *)(path_local + 600) = tmp_err_msg._0_4_;
  *(size_t *)(path_local + 0x250) = path_len;
  path_local[0x13d20] = '\0';
  path_local[0x13d21] = '\0';
  path_local[0x13d22] = '\0';
  path_local[0x13d23] = '\0';
  path_local[0x13d24] = '\0';
  path_local[0x13d25] = '\0';
  path_local[0x13d26] = '\0';
  path_local[0x13d27] = '\0';
  path_local[0x13be0] = '\0';
  path_local[0x13be1] = '\0';
  path_local[0x13be2] = '\0';
  path_local[0x13be3] = '\0';
  return (LIBSSH2_CHANNEL *)0x0;
}

Assistant:

static LIBSSH2_CHANNEL *
scp_recv(LIBSSH2_SESSION * session, const char *path, libssh2_struct_stat * sb)
{
    size_t cmd_len;
    int rc;
    int tmp_err_code;
    const char *tmp_err_msg;

    if(session->scpRecv_state == libssh2_NB_state_idle) {
        session->scpRecv_mode = 0;
        session->scpRecv_size = 0;
        session->scpRecv_mtime = 0;
        session->scpRecv_atime = 0;

        session->scpRecv_command_len =
            _libssh2_shell_quotedsize(path) + sizeof("scp -f ") + (sb ? 1 : 0);

        session->scpRecv_command =
            LIBSSH2_ALLOC(session, session->scpRecv_command_len);

        if(!session->scpRecv_command) {
            _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                           "Unable to allocate a command buffer for "
                           "SCP session");
            return NULL;
        }

        snprintf((char *)session->scpRecv_command,
                 session->scpRecv_command_len,
                 "scp -%sf ", sb ? "p" : "");

        cmd_len = strlen((char *)session->scpRecv_command);

        if(!session->flag.quote_paths) {
            size_t path_len;

            path_len = strlen(path);

            /* no NUL-termination needed, so memcpy will do */
            memcpy(&session->scpRecv_command[cmd_len], path, path_len);
            cmd_len += path_len;
        }
        else {
            cmd_len += shell_quotearg(path,
                                      &session->scpRecv_command[cmd_len],
                                      session->scpRecv_command_len - cmd_len);
        }

        /* the command to exec should _not_ be NUL-terminated */
        session->scpRecv_command_len = cmd_len;

        _libssh2_debug((session, LIBSSH2_TRACE_SCP,
                       "Opening channel for SCP receive"));

        session->scpRecv_state = libssh2_NB_state_created;
    }

    if(session->scpRecv_state == libssh2_NB_state_created) {
        /* Allocate a channel */
        session->scpRecv_channel =
            _libssh2_channel_open(session, "session",
                                  sizeof("session") - 1,
                                  LIBSSH2_CHANNEL_WINDOW_DEFAULT,
                                  LIBSSH2_CHANNEL_PACKET_DEFAULT, NULL,
                                  0);
        if(!session->scpRecv_channel) {
            if(libssh2_session_last_errno(session) !=
                LIBSSH2_ERROR_EAGAIN) {
                LIBSSH2_FREE(session, session->scpRecv_command);
                session->scpRecv_command = NULL;
                session->scpRecv_state = libssh2_NB_state_idle;
            }
            else {
                _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                               "Would block starting up channel");
            }
            return NULL;
        }

        session->scpRecv_state = libssh2_NB_state_sent;
    }

    if(session->scpRecv_state == libssh2_NB_state_sent) {
        /* Request SCP for the desired file */
        rc = _libssh2_channel_process_startup(session->scpRecv_channel, "exec",
                                              sizeof("exec") - 1,
                                              (char *)session->scpRecv_command,
                                              session->scpRecv_command_len);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block requesting SCP startup");
            return NULL;
        }
        else if(rc) {
            LIBSSH2_FREE(session, session->scpRecv_command);
            session->scpRecv_command = NULL;
            goto scp_recv_error;
        }
        LIBSSH2_FREE(session, session->scpRecv_command);
        session->scpRecv_command = NULL;

        _libssh2_debug((session, LIBSSH2_TRACE_SCP, "Sending initial wakeup"));
        /* SCP ACK */
        session->scpRecv_response[0] = '\0';

        session->scpRecv_state = libssh2_NB_state_sent1;
    }

    if(session->scpRecv_state == libssh2_NB_state_sent1) {
        rc = (int)_libssh2_channel_write(session->scpRecv_channel, 0,
                                         session->scpRecv_response, 1);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block sending initial wakeup");
            return NULL;
        }
        else if(rc != 1) {
            goto scp_recv_error;
        }

        /* Parse SCP response */
        session->scpRecv_response_len = 0;

        session->scpRecv_state = libssh2_NB_state_sent2;
    }

    if((session->scpRecv_state == libssh2_NB_state_sent2)
        || (session->scpRecv_state == libssh2_NB_state_sent3)) {
        while(sb && (session->scpRecv_response_len <
                     LIBSSH2_SCP_RESPONSE_BUFLEN)) {
            unsigned char *s, *p;

            if(session->scpRecv_state == libssh2_NB_state_sent2) {
                rc = (int)_libssh2_channel_read(session->scpRecv_channel, 0,
                                                (char *) session->
                                                scpRecv_response +
                                                session->scpRecv_response_len,
                                                1);
                if(rc == LIBSSH2_ERROR_EAGAIN) {
                    _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                                   "Would block waiting for SCP response");
                    return NULL;
                }
                else if(rc < 0) {
                    /* error, give up */
                    _libssh2_error(session, rc, "Failed reading SCP response");
                    goto scp_recv_error;
                }
                else if(rc == 0)
                    goto scp_recv_empty_channel;

                session->scpRecv_response_len++;

                if(session->scpRecv_response[0] != 'T') {
                    size_t err_len;
                    char *err_msg;

                    /* there can be
                       01 for warnings
                       02 for errors

                       The following string MUST be newline terminated
                    */
                    err_len =
                        _libssh2_channel_packet_data_len(session->
                                                         scpRecv_channel, 0);
                    err_msg = LIBSSH2_ALLOC(session, err_len + 1);
                    if(!err_msg) {
                        _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                       "Failed to get memory ");
                        goto scp_recv_error;
                    }

                    /* Read the remote error message */
                    (void)_libssh2_channel_read(session->scpRecv_channel, 0,
                                                err_msg, err_len);
                    /* If it failed for any reason, we ignore it anyway. */

                    /* zero terminate the error */
                    err_msg[err_len] = 0;

                    _libssh2_debug((session, LIBSSH2_TRACE_SCP,
                                   "got %02x %s", session->scpRecv_response[0],
                                   err_msg));

                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Failed to recv file");

                    LIBSSH2_FREE(session, err_msg);
                    goto scp_recv_error;
                }

                if((session->scpRecv_response_len > 1) &&
                    ((session->
                      scpRecv_response[session->scpRecv_response_len - 1] <
                      '0')
                     || (session->
                         scpRecv_response[session->scpRecv_response_len - 1] >
                         '9'))
                    && (session->
                        scpRecv_response[session->scpRecv_response_len - 1] !=
                        ' ')
                    && (session->
                        scpRecv_response[session->scpRecv_response_len - 1] !=
                        '\r')
                    && (session->
                        scpRecv_response[session->scpRecv_response_len - 1] !=
                        '\n')) {
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid data in SCP response");
                    goto scp_recv_error;
                }

                if((session->scpRecv_response_len < 9)
                    || (session->
                        scpRecv_response[session->scpRecv_response_len - 1] !=
                        '\n')) {
                    if(session->scpRecv_response_len ==
                        LIBSSH2_SCP_RESPONSE_BUFLEN) {
                        /* You had your chance */
                        _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                       "Unterminated response from "
                                       "SCP server");
                        goto scp_recv_error;
                    }
                    /* Way too short to be an SCP response, or not done yet,
                       short circuit */
                    continue;
                }

                /* We're guaranteed not to go under response_len == 0 by the
                   logic above */
                while((session->
                        scpRecv_response[session->scpRecv_response_len - 1] ==
                        '\r')
                       || (session->
                           scpRecv_response[session->scpRecv_response_len -
                                            1] == '\n'))
                    session->scpRecv_response_len--;
                session->scpRecv_response[session->scpRecv_response_len] =
                    '\0';

                if(session->scpRecv_response_len < 8) {
                    /* EOL came too soon */
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid response from SCP server, "
                                   "too short");
                    goto scp_recv_error;
                }

                s = session->scpRecv_response + 1;

                p = (unsigned char *) strchr((char *) s, ' ');
                if(!p || ((p - s) <= 0)) {
                    /* No spaces or space in the wrong spot */
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid response from SCP server, "
                                   "malformed mtime");
                    goto scp_recv_error;
                }

                *(p++) = '\0';
                /* Make sure we don't get fooled by leftover values */
                session->scpRecv_mtime = strtol((char *) s, NULL, 10);

                s = (unsigned char *) strchr((char *) p, ' ');
                if(!s || ((s - p) <= 0)) {
                    /* No spaces or space in the wrong spot */
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid response from SCP server, "
                                   "malformed mtime.usec");
                    goto scp_recv_error;
                }

                /* Ignore mtime.usec */
                s++;
                p = (unsigned char *) strchr((char *) s, ' ');
                if(!p || ((p - s) <= 0)) {
                    /* No spaces or space in the wrong spot */
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid response from SCP server, "
                                   "too short or malformed");
                    goto scp_recv_error;
                }

                *p = '\0';
                /* Make sure we don't get fooled by leftover values */
                session->scpRecv_atime = strtol((char *) s, NULL, 10);

                /* SCP ACK */
                session->scpRecv_response[0] = '\0';

                session->scpRecv_state = libssh2_NB_state_sent3;
            }

            if(session->scpRecv_state == libssh2_NB_state_sent3) {
                rc = (int)_libssh2_channel_write(session->scpRecv_channel, 0,
                                                 session->scpRecv_response, 1);
                if(rc == LIBSSH2_ERROR_EAGAIN) {
                    _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                                   "Would block waiting to send SCP ACK");
                    return NULL;
                }
                else if(rc != 1) {
                    goto scp_recv_error;
                }

                _libssh2_debug((session, LIBSSH2_TRACE_SCP,
                               "mtime = %ld, atime = %ld",
                               session->scpRecv_mtime,
                               session->scpRecv_atime));

                /* We *should* check that atime.usec is valid, but why let
                   that stop use? */
                break;
            }
        }

        session->scpRecv_state = libssh2_NB_state_sent4;
    }

    if(session->scpRecv_state == libssh2_NB_state_sent4) {
        session->scpRecv_response_len = 0;

        session->scpRecv_state = libssh2_NB_state_sent5;
    }

    if((session->scpRecv_state == libssh2_NB_state_sent5)
        || (session->scpRecv_state == libssh2_NB_state_sent6)) {
        while(session->scpRecv_response_len < LIBSSH2_SCP_RESPONSE_BUFLEN) {
            char *s, *p, *e = NULL;

            if(session->scpRecv_state == libssh2_NB_state_sent5) {
                rc = (int)_libssh2_channel_read(session->scpRecv_channel, 0,
                                                (char *) session->
                                                scpRecv_response +
                                                session->scpRecv_response_len,
                                                1);
                if(rc == LIBSSH2_ERROR_EAGAIN) {
                    _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                                   "Would block waiting for SCP response");
                    return NULL;
                }
                else if(rc < 0) {
                    /* error, bail out */
                    _libssh2_error(session, rc, "Failed reading SCP response");
                    goto scp_recv_error;
                }
                else if(rc == 0)
                    goto scp_recv_empty_channel;

                session->scpRecv_response_len++;

                if(session->scpRecv_response[0] != 'C') {
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid response from SCP server");
                    goto scp_recv_error;
                }

                if((session->scpRecv_response_len > 1) &&
                    (session->
                     scpRecv_response[session->scpRecv_response_len - 1] !=
                     '\r')
                    && (session->
                        scpRecv_response[session->scpRecv_response_len - 1] !=
                        '\n')
                    &&
                    (session->
                     scpRecv_response[session->scpRecv_response_len - 1]
                     < 32)) {
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid data in SCP response");
                    goto scp_recv_error;
                }

                if((session->scpRecv_response_len < 7)
                    || (session->
                        scpRecv_response[session->scpRecv_response_len - 1] !=
                        '\n')) {
                    if(session->scpRecv_response_len ==
                        LIBSSH2_SCP_RESPONSE_BUFLEN) {
                        /* You had your chance */
                        _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                       "Unterminated response "
                                       "from SCP server");
                        goto scp_recv_error;
                    }
                    /* Way too short to be an SCP response, or not done yet,
                       short circuit */
                    continue;
                }

                /* We're guaranteed not to go under response_len == 0 by the
                   logic above */
                while((session->
                        scpRecv_response[session->scpRecv_response_len - 1] ==
                        '\r')
                       || (session->
                           scpRecv_response[session->scpRecv_response_len -
                                            1] == '\n')) {
                    session->scpRecv_response_len--;
                }
                session->scpRecv_response[session->scpRecv_response_len] =
                    '\0';

                if(session->scpRecv_response_len < 6) {
                    /* EOL came too soon */
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid response from SCP server, "
                                   "too short");
                    goto scp_recv_error;
                }

                s = (char *) session->scpRecv_response + 1;

                p = strchr(s, ' ');
                if(!p || ((p - s) <= 0)) {
                    /* No spaces or space in the wrong spot */
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid response from SCP server, "
                                   "malformed mode");
                    goto scp_recv_error;
                }

                *(p++) = '\0';
                /* Make sure we don't get fooled by leftover values */
                session->scpRecv_mode = strtol(s, &e, 8);
                if(e && *e) {
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid response from SCP server, "
                                   "invalid mode");
                    goto scp_recv_error;
                }

                s = strchr(p, ' ');
                if(!s || ((s - p) <= 0)) {
                    /* No spaces or space in the wrong spot */
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid response from SCP server, "
                                   "too short or malformed");
                    goto scp_recv_error;
                }

                *s = '\0';
                /* Make sure we don't get fooled by leftover values */
                session->scpRecv_size = scpsize_strtol(p, &e, 10);
                if(e && *e) {
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid response from SCP server, "
                                   "invalid size");
                    goto scp_recv_error;
                }

                /* SCP ACK */
                session->scpRecv_response[0] = '\0';

                session->scpRecv_state = libssh2_NB_state_sent6;
            }

            if(session->scpRecv_state == libssh2_NB_state_sent6) {
                rc = (int)_libssh2_channel_write(session->scpRecv_channel, 0,
                                                 session->scpRecv_response, 1);
                if(rc == LIBSSH2_ERROR_EAGAIN) {
                    _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                                   "Would block sending SCP ACK");
                    return NULL;
                }
                else if(rc != 1) {
                    goto scp_recv_error;
                }
                _libssh2_debug((session, LIBSSH2_TRACE_SCP,
                               "mode = 0%lo size = %ld", session->scpRecv_mode,
                               (long)session->scpRecv_size));

                /* We *should* check that basename is valid, but why let that
                   stop us? */
                break;
            }
        }

        session->scpRecv_state = libssh2_NB_state_sent7;
    }

    if(sb) {
        memset(sb, 0, sizeof(libssh2_struct_stat));

        sb->st_mtime = session->scpRecv_mtime;
        sb->st_atime = session->scpRecv_atime;
        sb->st_size = (libssh2_struct_stat_size)session->scpRecv_size;
        sb->st_mode = (unsigned short)session->scpRecv_mode;
    }

    session->scpRecv_state = libssh2_NB_state_idle;
    return session->scpRecv_channel;

scp_recv_empty_channel:
    /* the code only jumps here as a result of a zero read from channel_read()
       so we check EOF status to avoid getting stuck in a loop */
    if(libssh2_channel_eof(session->scpRecv_channel))
        _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                       "Unexpected channel close");
    else
        return session->scpRecv_channel;
    /* fall-through */
scp_recv_error:
    tmp_err_code = session->err_code;
    tmp_err_msg = session->err_msg;
    while(libssh2_channel_free(session->scpRecv_channel) ==
          LIBSSH2_ERROR_EAGAIN);
    session->err_code = tmp_err_code;
    session->err_msg = tmp_err_msg;
    session->scpRecv_channel = NULL;
    session->scpRecv_state = libssh2_NB_state_idle;
    return NULL;
}